

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool IsValidSubDEdge(ON_SubDEdge *edge,unsigned_short level,uint *edge_id_range,bool bSilentError)

{
  ON_SubDEdgeTag OVar1;
  uint uVar2;
  ON_SubDVertex *pOVar3;
  bool bVar4;
  byte unaff_BPL;
  long lVar5;
  ON_Internal_DamagedMarker dm;
  ON_SubDVertex *edge_vertex [2];
  ON_Internal_DamagedMarker local_50;
  long local_48 [3];
  
  if (((edge == (ON_SubDEdge *)0x0) || ((edge->super_ON_SubDComponentBase).m_level != level)) ||
     ((edge_id_range != (uint *)0x0 &&
      ((uVar2 = (edge->super_ON_SubDComponentBase).m_id, uVar2 < *edge_id_range ||
       (edge_id_range[1] < uVar2)))))) {
    ON_SubDIncrementErrorCount();
    if (!bSilentError) {
      bVar4 = ON_IsNotValid();
      return bVar4;
    }
    unaff_BPL = 0;
    goto LAB_005d9fe4;
  }
  local_48[0] = 0;
  local_48[1] = 0;
  lVar5 = 0;
  bVar4 = false;
  local_50.m_subd_component = &edge->super_ON_SubDComponentBase;
  do {
    pOVar3 = edge->m_vertex[lVar5];
    if (pOVar3 == (ON_SubDVertex *)0x0) {
      ON_SubDIncrementErrorCount();
      if (bSilentError) {
        unaff_BPL = 0;
      }
      else {
        unaff_BPL = ON_IsNotValid();
      }
    }
    else {
      local_48[lVar5] = (long)pOVar3;
    }
    if (pOVar3 == (ON_SubDVertex *)0x0) break;
    lVar5 = lVar5 + 1;
    bVar4 = lVar5 != 1;
  } while (lVar5 == 1);
  if (bVar4) {
    if (local_48[0] == local_48[1]) {
      ON_SubDIncrementErrorCount();
    }
    else {
      OVar1 = edge->m_edge_tag;
      if (OVar1 == SmoothX) {
LAB_005d9f8c:
        if (edge->m_face_count != 2) {
          ON_SubDIncrementErrorCount();
          goto LAB_005d9fcb;
        }
      }
      else if (OVar1 != Crease) {
        if (OVar1 != Smooth) {
          ON_SubDIncrementErrorCount();
          goto LAB_005d9fcb;
        }
        goto LAB_005d9f8c;
      }
      if ((edge->m_face_count < 3) || (edge->m_facex != (ON_SubDFacePtr *)0x0)) {
        local_50.m_subd_component = (ON_SubDComponentBase *)0x0;
        unaff_BPL = 1;
        goto LAB_005d9fda;
      }
      ON_SubDIncrementErrorCount();
    }
LAB_005d9fcb:
    if (bSilentError) {
      unaff_BPL = 0;
    }
    else {
      unaff_BPL = ON_IsNotValid();
    }
  }
LAB_005d9fda:
  ON_Internal_DamagedMarker::~ON_Internal_DamagedMarker(&local_50);
LAB_005d9fe4:
  return (bool)(unaff_BPL & 1);
}

Assistant:

static bool IsValidSubDEdge(
  const ON_SubDEdge* edge,
  unsigned short level,
  unsigned int* edge_id_range,
  bool bSilentError
  )
{
  if (nullptr == edge)
    return ON_SubDIsNotValid(bSilentError);

  if (edge->SubdivisionLevel() != level)
    return ON_SubDIsNotValid(bSilentError);

  if (nullptr != edge_id_range)
  {
    if (edge->m_id < edge_id_range[0])
      return ON_SubDIsNotValid(bSilentError);
    if (edge->m_id > edge_id_range[1])
      return ON_SubDIsNotValid(bSilentError);
  }

  ON_Internal_DamagedMarker dm(edge);

  const ON_SubDVertex* edge_vertex[2] = {};
  for (unsigned int i = 0; i < 2; i++)
  {
    const ON_SubDVertex* vertex = edge->Vertex(i);
    if (nullptr == vertex)
      return ON_SubDIsNotValid(bSilentError);
    edge_vertex[i] = vertex;
  }
  if (edge_vertex[0] == edge_vertex[1])
    return ON_SubDIsNotValid(bSilentError);

  if (edge->IsSmooth())
  {
    // m_edge_tag is ON_SubDEdgeTag::Smooth or ON_SubDEdgeTag::SmoothX
    if ( 2 != edge->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
  }
  else if (ON_SubDEdgeTag::Crease != edge->m_edge_tag)
  {
    return ON_SubDIsNotValid(bSilentError);
  }

  if (edge->m_face_count > 2 && nullptr == edge->m_facex)
    return ON_SubDIsNotValid(bSilentError);

  dm.ClearComponent();

  return true;
}